

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<std::complex<long_double>_>::Simetrize(TPZMatrix<std::complex<long_double>_> *this)

{
  int iVar1;
  int64_t iVar2;
  int64_t iVar3;
  undefined4 extraout_var;
  undefined8 *puVar5;
  TPZBaseMatrix *in_RDI;
  int64_t fDim1;
  int64_t col;
  int64_t row;
  char *in_stack_000001c8;
  char *in_stack_000001d0;
  long local_18;
  long local_10;
  undefined8 *puVar4;
  undefined4 extraout_var_00;
  
  iVar2 = TPZBaseMatrix::Rows(in_RDI);
  iVar3 = TPZBaseMatrix::Cols(in_RDI);
  if (iVar2 != iVar3) {
    Error(in_stack_000001d0,in_stack_000001c8);
  }
  iVar2 = TPZBaseMatrix::Rows(in_RDI);
  for (local_10 = 0; local_18 = local_10, local_10 < iVar2; local_10 = local_10 + 1) {
    while (local_18 = local_18 + 1, local_18 < iVar2) {
      iVar1 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x22])(in_RDI,local_10,local_18);
      puVar4 = (undefined8 *)CONCAT44(extraout_var,iVar1);
      iVar1 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x22])(in_RDI,local_18,local_10);
      puVar5 = (undefined8 *)CONCAT44(extraout_var_00,iVar1);
      *puVar5 = *puVar4;
      puVar5[1] = puVar4[1];
      puVar5[2] = puVar4[2];
      puVar5[3] = puVar4[3];
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Simetrize() {
  
  if ( Rows() != Cols() ) {
    Error( "Simetrize only work for square matrices" );
  }
  
  int64_t row,col;
  int64_t fDim1 = Rows();
  for(row=0; row<fDim1; row++) {
    for(col=row+1; col<fDim1; col++) {
      this->s(col,row) = this->s(row,col);
    }
  }
  
}